

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O1

JavascriptString * __thiscall Js::JavascriptFunction::GetDisplayName(JavascriptFunction *this)

{
  byte bVar1;
  ScriptContext *scriptContext;
  JavascriptLibrary *pJVar2;
  bool bVar3;
  int iVar4;
  FunctionProxy *this_00;
  ParseableFunctionInfo *pPVar5;
  undefined4 extraout_var;
  JavascriptString *pJVar6;
  JavascriptString *local_20;
  JavascriptString *sourceStringName;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = GetFunctionProxy(this);
  if (this_00 == (FunctionProxy *)0x0) {
    pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    local_20 = (JavascriptString *)0x0;
    bVar3 = GetSourceStringName(this,&local_20);
    if (!bVar3) {
      local_20 = StringCache::GetFunctionDisplay(&pJVar2->stringCache);
    }
    return local_20;
  }
  pPVar5 = FunctionProxy::EnsureDeserialized(this_00);
  bVar1 = (pPVar5->super_FunctionProxy).field_0x44;
  iVar4 = (*(pPVar5->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])(pPVar5);
  if ((bVar1 & 0x20) != 0) {
    pJVar6 = JavascriptString::NewWithSz((char16 *)CONCAT44(extraout_var,iVar4),scriptContext);
    return pJVar6;
  }
  pJVar6 = JavascriptString::NewCopySz((char16 *)CONCAT44(extraout_var,iVar4),scriptContext);
  return pJVar6;
}

Assistant:

JavascriptString* JavascriptFunction::GetDisplayName() const
    {
        ScriptContext* scriptContext = this->GetScriptContext();
        FunctionProxy* proxy = this->GetFunctionProxy();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        if (proxy)
        {
            ParseableFunctionInfo * func = proxy->EnsureDeserialized();
            if (func->GetDisplayNameIsRecyclerAllocated())
            {
                return JavascriptString::NewWithSz(func->GetDisplayName(), scriptContext);
            }
            else
            {
                return JavascriptString::NewCopySz(func->GetDisplayName(), scriptContext);
            }
        }
        JavascriptString* sourceStringName = nullptr;
        if (GetSourceStringName(&sourceStringName))
        {
            return sourceStringName;
        }

        return library->GetFunctionDisplayString();
    }